

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_set.hpp
# Opt level: O0

void __thiscall
duckdb::FunctionSet<duckdb::ScalarFunction>::~FunctionSet(FunctionSet<duckdb::ScalarFunction> *this)

{
  string *in_RDI;
  
  vector<duckdb::ScalarFunction,_true>::~vector((vector<duckdb::ScalarFunction,_true> *)0xbcd21c);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

explicit FunctionSet(string name) : name(std::move(name)) {
	}